

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

char * __thiscall util::fs::basename(fs *this,char *__filename)

{
  char *pcVar1;
  bool bVar2;
  long local_40;
  size_t base;
  allocator local_21;
  long local_20;
  size_t len;
  string *path_local;
  
  len = (size_t)__filename;
  path_local = (string *)this;
  local_20 = std::__cxx11::string::size();
  while( true ) {
    bVar2 = false;
    if (local_20 != 0) {
      pcVar1 = (char *)std::__cxx11::string::operator[](len);
      bVar2 = *pcVar1 == '/';
    }
    if (!bVar2) break;
    local_20 = local_20 + -1;
  }
  local_40 = local_20;
  if (local_20 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,anon_var_dwarf_1adeb + 0xb,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    do {
      local_40 = local_40 + -1;
      bVar2 = false;
      if (local_40 != 0) {
        pcVar1 = (char *)std::__cxx11::string::operator[](len);
        bVar2 = *pcVar1 != '/';
      }
    } while (bVar2);
    std::__cxx11::string::substr((ulong)this,len);
  }
  return (char *)this;
}

Assistant:

std::string
basename (std::string const& path)
{
    /* Skip group of slashes at the end. */
    std::size_t len = path.size();
    while (len > 0 && path[len - 1] == '/')
        len -= 1;
    if (len == 0)
        return "";

    /* Skip basename. */
    std::size_t base = len - 1;
    while (base > 0 && path[base - 1] != '/')
        base -= 1;

    return path.substr(base, len - base);
}